

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict st_assert(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  node_t_conflict pnVar3;
  char *expected_name;
  node_t_conflict local_38;
  pos_t pos;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x117,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    if (ppVar1->record_level != 0) {
      return &err_struct;
    }
    iVar2 = 0x117;
  }
  else {
    iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      if (ppVar1->record_level != 0) {
        return &err_struct;
      }
      iVar2 = 0x28;
    }
    else {
      pnVar3 = cond_expr(c2m_ctx,no_err_p);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
      local_38 = pnVar3;
      iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        if (ppVar1->record_level != 0) {
          return &err_struct;
        }
        iVar2 = 0x2c;
      }
      else {
        iVar2 = match(c2m_ctx,0x102,(pos_t *)0x0,(node_code_t *)0x0,&local_38);
        if (iVar2 == 0) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          expected_name = "string";
          goto LAB_0016457b;
        }
        iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          iVar2 = 0x29;
        }
        else {
          iVar2 = match(c2m_ctx,0x3b,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 != 0) {
            pnVar3 = new_pos_node2(c2m_ctx,N_ST_ASSERT,pos,pnVar3,local_38);
            return pnVar3;
          }
          if (ppVar1->record_level != 0) {
            return &err_struct;
          }
          iVar2 = 0x3b;
        }
      }
    }
  }
  expected_name = get_token_name(c2m_ctx,iVar2);
LAB_0016457b:
  syntax_error(c2m_ctx,expected_name);
  return &err_struct;
}

Assistant:

D (st_assert) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, r;
  pos_t pos;

  PTP (T_STATIC_ASSERT, pos);
  PT ('(');
  P (const_expr);
  op1 = r;
  PT (',');
  PTN (T_STR);
  PT (')');
  PT (';');
  r = new_pos_node2 (c2m_ctx, N_ST_ASSERT, pos, op1, r);
  return r;
}